

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O2

void Omega_h::map_value_into<signed_char>(char a_value,LOs *a2b,Write<signed_char> *b_data)

{
  Alloc *pAVar1;
  ulong uVar2;
  type functor;
  type local_40;
  
  pAVar1 = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar2 = pAVar1->size;
  }
  else {
    uVar2 = (ulong)pAVar1 >> 3;
  }
  Write<signed_char>::Write(&local_40.b_data,b_data);
  Write<int>::Write(&local_40.a2b.write_,&a2b->write_);
  local_40.a_value = a_value;
  parallel_for<Omega_h::map_value_into<signed_char>(signed_char,Omega_h::Read<int>,Omega_h::Write<signed_char>)::_lambda(int)_1_>
            ((LO)(uVar2 >> 2),&local_40,"map_value_into");
  map_value_into<signed_char>(signed_char,Omega_h::Read<int>,Omega_h::Write<signed_char>)::
  {lambda(int)#1}::~Write((_lambda_int__1_ *)&local_40);
  return;
}

Assistant:

void map_value_into(T a_value, LOs a2b, Write<T> b_data) {
  auto na = a2b.size();
  auto functor = OMEGA_H_LAMBDA(LO a) { b_data[a2b[a]] = a_value; };
  parallel_for("map_value_into", na, std::move(functor));
}